

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O2

void multikey_simd_b<unsigned_int>
               (uchar **strings,size_t N,size_t depth,uchar **sorted,uint8_t *oracle)

{
  uchar *puVar1;
  value_type_conflict vVar2;
  unsigned_long N_00;
  uchar **strings_00;
  uchar **sorted_00;
  uint8_t *oracle_00;
  uint j;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  long lVar8;
  size_t i;
  ulong uVar9;
  ulong uVar10;
  char cVar15;
  int iVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar23 [16];
  int iVar24;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  array<unsigned_long,_3UL> bucketsize;
  size_t bucketindex [3];
  array<unsigned_long,_3UL> local_d8;
  uchar **local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  value_type_conflict local_88;
  size_t local_80;
  long local_78;
  uchar **local_68;
  ulong local_60;
  size_t local_58;
  uint8_t *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 auVar12 [12];
  int iVar19;
  undefined1 auVar21 [12];
  undefined1 auVar22 [16];
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  undefined1 auVar31 [12];
  undefined1 auVar32 [16];
  
  if (N < 0x20) {
    insertion_sort(strings,(int)N,depth);
    return;
  }
  local_68 = sorted;
  uVar3 = pseudo_median<unsigned_int>(strings,N,depth);
  local_88 = 0;
  std::array<unsigned_long,_3UL>::fill(&local_d8,&local_88);
  cVar15 = (char)(uVar3 >> 0x18);
  local_48._0_3_ = (undefined3)uVar3;
  local_48 = CONCAT13(cVar15 + -0x80,(undefined3)local_48);
  uStack_44 = CONCAT13(cVar15 + -0x80,(undefined3)local_48);
  uStack_40 = CONCAT13(cVar15 + -0x80,(undefined3)local_48);
  uStack_3c = CONCAT13(cVar15 + -0x80,(undefined3)local_48);
  local_c0 = strings;
  local_50 = oracle;
  local_58 = N;
  local_60 = N & 0xfffffffffffffff0;
  for (uVar9 = 0; oracle_00 = local_50, sorted_00 = local_68, strings_00 = local_c0,
      uVar10 = local_60, uVar9 < local_60; uVar9 = uVar9 + 0x10) {
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    }
    uVar4 = get_char<unsigned_int>(local_c0[uVar9],depth);
    local_98 = CONCAT44(local_98._4_4_,uVar4);
    uVar4 = get_char<unsigned_int>(strings_00[uVar9 + 4],depth);
    uVar5 = get_char<unsigned_int>(strings_00[uVar9 + 8],depth);
    uVar6 = get_char<unsigned_int>(strings_00[uVar9 + 0xc],depth);
    local_98 = CONCAT44(uVar4,(undefined4)local_98);
    uStack_90 = CONCAT44(uVar6,uVar5);
    uVar4 = get_char<unsigned_int>(strings_00[uVar9 + 1],depth);
    local_a8 = CONCAT44(local_a8._4_4_,uVar4);
    uVar4 = get_char<unsigned_int>(strings_00[uVar9 + 5],depth);
    uVar5 = get_char<unsigned_int>(strings_00[uVar9 + 9],depth);
    uVar6 = get_char<unsigned_int>(strings_00[uVar9 + 0xd],depth);
    local_a8 = CONCAT44(uVar4,(undefined4)local_a8);
    uStack_a0 = CONCAT44(uVar6,uVar5);
    uVar4 = get_char<unsigned_int>(strings_00[uVar9 + 2],depth);
    local_b8 = CONCAT44(local_b8._4_4_,uVar4);
    uVar4 = get_char<unsigned_int>(strings_00[uVar9 + 6],depth);
    uVar5 = get_char<unsigned_int>(strings_00[uVar9 + 10],depth);
    uVar6 = get_char<unsigned_int>(strings_00[uVar9 + 0xe],depth);
    local_b8 = CONCAT44(uVar4,(undefined4)local_b8);
    uStack_b0 = CONCAT44(uVar6,uVar5);
    uVar4 = get_char<unsigned_int>(strings_00[uVar9 + 3],depth);
    uVar5 = get_char<unsigned_int>(strings_00[uVar9 + 7],depth);
    uVar6 = get_char<unsigned_int>(strings_00[uVar9 + 0xb],depth);
    N = local_58;
    uVar7 = get_char<unsigned_int>(strings_00[uVar9 + 0xf],depth);
    iVar20 = CONCAT22(local_98._2_2_ + -0x8000,(undefined2)local_98);
    auVar21._0_8_ = CONCAT26(local_98._6_2_ + -0x8000,CONCAT24(local_98._4_2_,iVar20));
    auVar21._8_2_ = (undefined2)uStack_90;
    auVar21._10_2_ = uStack_90._2_2_ + -0x8000;
    auVar22._12_2_ = uStack_90._4_2_;
    auVar22._0_12_ = auVar21;
    auVar22._14_2_ = uStack_90._6_2_ + -0x8000;
    iVar24 = CONCAT22(local_a8._2_2_ + -0x8000,(undefined2)local_a8);
    auVar25._0_8_ = CONCAT26(local_a8._6_2_ + -0x8000,CONCAT24(local_a8._4_2_,iVar24));
    auVar25._8_2_ = (undefined2)uStack_a0;
    auVar25._10_2_ = uStack_a0._2_2_ + -0x8000;
    auVar26._12_2_ = uStack_a0._4_2_;
    auVar26._0_12_ = auVar25;
    auVar26._14_2_ = uStack_a0._6_2_ + -0x8000;
    iVar30 = CONCAT22(local_b8._2_2_ + -0x8000,(undefined2)local_b8);
    auVar31._0_8_ = CONCAT26(local_b8._6_2_ + -0x8000,CONCAT24(local_b8._4_2_,iVar30));
    auVar31._8_2_ = (undefined2)uStack_b0;
    auVar31._10_2_ = uStack_b0._2_2_ + -0x8000;
    auVar32._12_2_ = uStack_b0._4_2_;
    auVar32._0_12_ = auVar31;
    auVar32._14_2_ = uStack_b0._6_2_ + -0x8000;
    iVar11 = CONCAT22((short)(uVar4 >> 0x10) + -0x8000,(short)uVar4);
    auVar12._0_8_ = CONCAT26((short)(uVar5 >> 0x10) + -0x8000,CONCAT24((short)uVar5,iVar11));
    auVar12._8_2_ = (undefined2)uVar6;
    auVar12._10_2_ = (short)(uVar6 >> 0x10) + -0x8000;
    auVar14._12_2_ = (undefined2)uVar7;
    auVar14._0_12_ = auVar12;
    auVar14._14_2_ = (short)(uVar7 >> 0x10) + -0x8000;
    auVar16._0_4_ = -(uint)(iVar20 == local_48);
    iVar19 = (int)((ulong)auVar21._0_8_ >> 0x20);
    auVar16._4_4_ = -(uint)(iVar19 == uStack_44);
    auVar16._8_4_ = -(uint)(auVar21._8_4_ == uStack_40);
    auVar16._12_4_ = -(uint)(auVar22._12_4_ == uStack_3c);
    auVar23._0_4_ = -(uint)(local_48 < iVar20);
    auVar23._4_4_ = -(uint)(uStack_44 < iVar19);
    auVar23._8_4_ = -(uint)(uStack_40 < auVar21._8_4_);
    auVar23._12_4_ = -(uint)(uStack_3c < auVar22._12_4_);
    auVar34._0_4_ = -(uint)(iVar24 == local_48);
    iVar19 = (int)((ulong)auVar25._0_8_ >> 0x20);
    auVar34._4_4_ = -(uint)(iVar19 == uStack_44);
    auVar34._8_4_ = -(uint)(auVar25._8_4_ == uStack_40);
    auVar34._12_4_ = -(uint)(auVar26._12_4_ == uStack_3c);
    auVar27._0_4_ = -(uint)(local_48 < iVar24);
    auVar27._4_4_ = -(uint)(uStack_44 < iVar19);
    auVar27._8_4_ = -(uint)(uStack_40 < auVar25._8_4_);
    auVar27._12_4_ = -(uint)(uStack_3c < auVar26._12_4_);
    auVar28 = auVar27 & _DAT_00235fd0 | auVar34 & _DAT_00235fc0;
    auVar17._0_4_ = -(uint)(iVar30 == local_48);
    iVar19 = (int)((ulong)auVar31._0_8_ >> 0x20);
    auVar17._4_4_ = -(uint)(iVar19 == uStack_44);
    auVar17._8_4_ = -(uint)(auVar31._8_4_ == uStack_40);
    auVar17._12_4_ = -(uint)(auVar32._12_4_ == uStack_3c);
    auVar33._0_4_ = -(uint)(local_48 < iVar30);
    auVar33._4_4_ = -(uint)(uStack_44 < iVar19);
    auVar33._8_4_ = -(uint)(uStack_40 < auVar31._8_4_);
    auVar33._12_4_ = -(uint)(uStack_3c < auVar32._12_4_);
    auVar34 = auVar33 & _DAT_00235fd0 | auVar17 & _DAT_00235fc0;
    auVar18._0_4_ = -(uint)(iVar11 == local_48);
    iVar19 = (int)((ulong)auVar12._0_8_ >> 0x20);
    auVar18._4_4_ = -(uint)(iVar19 == uStack_44);
    auVar18._8_4_ = -(uint)(auVar12._8_4_ == uStack_40);
    auVar18._12_4_ = -(uint)(auVar14._12_4_ == uStack_3c);
    auVar13._0_4_ = -(uint)(local_48 < iVar11);
    auVar13._4_4_ = -(uint)(uStack_44 < iVar19);
    auVar13._8_4_ = -(uint)(uStack_40 < auVar12._8_4_);
    auVar13._12_4_ = -(uint)(uStack_3c < auVar14._12_4_);
    auVar14 = auVar13 & _DAT_00235fd0 | auVar18 & _DAT_00235fc0;
    auVar29._0_8_ = auVar28._0_8_ << 8;
    auVar29._8_8_ = auVar28._8_8_ << 8;
    auVar35._0_8_ = auVar34._0_8_ << 0x10;
    auVar35._8_8_ = auVar34._8_8_ << 0x10;
    auVar28._0_8_ = auVar14._0_8_ << 0x18;
    auVar28._8_8_ = auVar14._8_8_ << 0x18;
    *(undefined1 (*) [16])(local_50 + uVar9) =
         auVar28 | auVar35 | auVar29 | auVar23 & _DAT_00235fd0 | auVar16 & _DAT_00235fc0;
  }
  for (; uVar10 < N; uVar10 = uVar10 + 1) {
    uVar4 = get_char<unsigned_int>(strings_00[uVar10],depth);
    oracle_00[uVar10] = (uVar3 < uVar4) * '\x02' | uVar4 == uVar3;
  }
  for (uVar9 = 0; N_00 = local_d8._M_elems[0], N != uVar9; uVar9 = uVar9 + 1) {
    local_d8._M_elems[oracle_00[uVar9]] = local_d8._M_elems[oracle_00[uVar9]] + 1;
  }
  if (local_d8._M_elems[2] + local_d8._M_elems[1] + local_d8._M_elems[0] != N) {
    __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                  ,0x166,
                  "void multikey_simd_b(unsigned char **, size_t, size_t, unsigned char **__restrict, uint8_t *__restrict) [CharT = unsigned int]"
                 );
  }
  local_88 = 0;
  local_80 = local_d8._M_elems[0];
  local_78 = local_d8._M_elems[1] + local_d8._M_elems[0];
  for (uVar9 = 0; N != uVar9; uVar9 = uVar9 + 1) {
    puVar1 = strings_00[uVar9];
    vVar2 = (&local_88)[oracle_00[uVar9]];
    (&local_88)[oracle_00[uVar9]] = vVar2 + 1;
    sorted_00[vVar2] = puVar1;
  }
  memcpy(strings_00,sorted_00,N << 3);
  multikey_simd_b<unsigned_int>(strings_00,N_00,depth,sorted_00,oracle_00);
  if ((char)uVar3 != '\0') {
    multikey_simd_b<unsigned_int>
              (strings_00 + local_d8._M_elems[0],local_d8._M_elems[1],depth + 4,sorted_00,oracle_00)
    ;
  }
  multikey_simd_b<unsigned_int>
            (strings_00 + local_d8._M_elems[0] + local_d8._M_elems[1],local_d8._M_elems[2],depth,
             sorted_00,oracle_00);
  return;
}

Assistant:

static void
multikey_simd_b(unsigned char** strings, size_t N, size_t depth,
		unsigned char** restrict sorted, uint8_t* restrict oracle)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<true>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		++bucketsize[oracle[i]];
	}
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	multikey_simd_b<CharT>(strings, bucketsize[0], depth,
			sorted, oracle);
	if (not is_end(partval))
		multikey_simd_b<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT),
				sorted, oracle);
	multikey_simd_b<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth, sorted, oracle);
}